

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Json.h
# Opt level: O1

string * __thiscall
rlib::JsonT<void>::stringify_abi_cxx11_(string *__return_storage_ptr__,JsonT<void> *this)

{
  Format local_78;
  
  Stringify::Format::Format(&local_78);
  stringify_abi_cxx11_(__return_storage_ptr__,this,&local_78);
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_78.colon._M_dataplus._M_p != &local_78.colon.field_2) {
    operator_delete(local_78.colon._M_dataplus._M_p,local_78.colon.field_2._M_allocated_capacity + 1
                   );
  }
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_78.indent._M_dataplus._M_p != &local_78.indent.field_2) {
    operator_delete(local_78.indent._M_dataplus._M_p,
                    local_78.indent.field_2._M_allocated_capacity + 1);
  }
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_78.lf._M_dataplus._M_p != &local_78.lf.field_2) {
    operator_delete(local_78.lf._M_dataplus._M_p,local_78.lf.field_2._M_allocated_capacity + 1);
  }
  return __return_storage_ptr__;
}

Assistant:

std::string stringify() const {
			return stringify(typename Stringify::Format());
		}